

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_parting_blow(CHAR_DATA *ch,CHAR_DATA *victim)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int in_stack_000000a4;
  bool in_stack_000000ab;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  int in_stack_000000dc;
  bool in_stack_000000e2;
  bool in_stack_000000e3;
  int in_stack_000000e4;
  CHAR_DATA *in_stack_000000e8;
  CHAR_DATA *in_stack_000000f0;
  int in_stack_00000110;
  char *in_stack_00000118;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((*(long *)(in_RDI + 0xa8) == *(long *)(in_RSI + 0xa8)) &&
     (iVar1 = get_skill(in_stack_000000d0,in_stack_000000cc), 0 < iVar1)) {
    iVar1 = number_percent();
    iVar2 = get_skill(in_stack_000000d0,in_stack_000000cc);
    if (iVar1 < iVar2) {
      act((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          in_stack_ffffffffffffffd0,
          (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      act((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          in_stack_ffffffffffffffd0,
          (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      act((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          in_stack_ffffffffffffffd0,
          (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
      iVar1 = one_hit_new(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e3,
                          in_stack_000000e2,in_stack_000000dc,in_stack_00000110,in_stack_00000118);
      if (iVar1 == -1) {
        return true;
      }
    }
    else {
      check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
    }
  }
  return false;
}

Assistant:

bool check_parting_blow(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if (ch->in_room != victim->in_room)
		return false;

	if (get_skill(victim, gsn_parting_blow) <= 0)
		return false;

	if (number_percent() < get_skill(victim, gsn_parting_blow))
	{
		act("You get in one more shot as $N flees.", victim, 0, ch, TO_CHAR);
		act("$n gets in one more shot as $N flees.", victim, 0, ch, TO_NOTVICT);
		act("$n gets in one more shot as you flee.", victim, 0, ch, TO_VICT);

		check_improve(victim, gsn_parting_blow, true, 1);

		if (one_hit_new(victim, ch, gsn_parting_blow, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 100, nullptr) == -1) // death
			return true;
	}
	else
	{
		check_improve(victim, gsn_parting_blow, false, 3);
	}

	return false;
}